

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBVariableStrideTest::testInit(XFBVariableStrideTest *this)

{
  undefined1 local_58 [8];
  testCase test_case;
  GLuint stage;
  GLuint local_38;
  undefined8 local_2c;
  GLuint local_24;
  undefined8 *local_20;
  Type *type;
  GLuint i;
  GLuint n_types;
  XFBVariableStrideTest *this_local;
  
  _i = this;
  type._4_4_ = TestBase::getTypesNumber((TestBase *)this);
  for (type._0_4_ = 0; (uint)type < type._4_4_; type._0_4_ = (uint)type + 1) {
    join_0x00000010_0x00000000_ = TestBase::getType((TestBase *)this,(uint)type);
    local_2c = stack0xffffffffffffffc0;
    local_24 = local_38;
    local_20 = &local_2c;
    for (test_case.m_type.m_n_columns = 0; test_case.m_type.m_n_columns < 6;
        test_case.m_type.m_n_columns = test_case.m_type.m_n_columns + 1) {
      if (((test_case.m_type.m_n_columns != 0) && (test_case.m_type.m_n_columns != 2)) &&
         (test_case.m_type.m_n_columns != 5)) {
        local_58._0_4_ = VALID;
        local_58._4_4_ = test_case.m_type.m_n_columns;
        test_case._0_8_ = *local_20;
        test_case.m_type.m_basic_type = *(TYPES *)(local_20 + 1);
        std::
        vector<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>_>
        ::push_back(&this->m_test_cases,(value_type *)local_58);
      }
    }
  }
  return;
}

Assistant:

void XFBVariableStrideTest::testInit()
{
	const GLuint n_types = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type = getType(i);

		/*
		 Some of the cases are declared as following are considered as invalid,
		 but accoring to spec, the following declaration is valid: shaders in the
		 transform feedback capturing mode have an initial global default of layout(xfb_buffer=0) out,
		 so for the first variable's declaration, the xfb_stride = 16 is applied on buffer 0,  for the
		 second variable, its buffer is also inherited from global buffer 0, and its offset does not overflows
		 the stride.

		 The xfb_stride is the memory width of given buffer, not for variable even though xfb_stride
		 is declared on the variable. It seems that the writter of this case misunderstand the concept of
		 xfb_stride, because spec describes that xfb_stride can be declared multiple times for the same buffer,
		 it is a compile or link-time error to have different values specified for the stride for the same buffer.

		 int type_size = 8;
		 layout (xfb_offset = 0, xfb_stride = 2 * type_size) out double goku;
		 layout (xfb_offset = type_size)                     out double vegeta;
		 */
		// all the shaders are valid, so remove the following loop(it contains CASE_MAX is enum of valid and invalid)
		// for (GLuint c = 0; c < CASE_MAX; ++c)
		{
			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
					(Utils::Shader::FRAGMENT == stage))
				{
					continue;
				}

				testCase test_case = { (CASES)VALID, (Utils::Shader::STAGES)stage, type };

				m_test_cases.push_back(test_case);
			}
		}
	}
}